

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O0

int lsrkStep_TakeStepRKL(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  double *pdVar1;
  undefined8 *puVar2;
  N_Vector p_Var3;
  int iVar4;
  int iVar5;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  ARKodeMem in_RDI;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined8 uVar11;
  N_Vector temp;
  int j;
  sunrealtype ss;
  N_Vector *Xvecs;
  sunrealtype *cvals;
  ARKodeLSRKStepMem step_mem;
  sunrealtype p4;
  sunrealtype p8;
  sunrealtype nu;
  sunrealtype mu;
  sunrealtype cj;
  sunrealtype temj;
  sunrealtype cjm1;
  sunrealtype ajm1;
  sunrealtype bj;
  sunrealtype mus;
  sunrealtype bjm2;
  sunrealtype bjm1;
  sunrealtype w1;
  sunrealtype hmax;
  int retval;
  ARKodeLSRKStepMem in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar12;
  ARKodeMem in_stack_ffffffffffffff28;
  double local_d0;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  ARKodeMem in_stack_ffffffffffffff48;
  undefined8 *local_a0;
  double local_68;
  double local_48;
  double local_40;
  int local_4;
  
  *in_RDX = 0;
  *in_RSI = 0;
  local_4 = lsrkStep_AccessStepMem
                      (in_stack_ffffffffffffff28,
                       (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (ARKodeLSRKStepMem *)in_stack_ffffffffffffff18);
  if (local_4 == 0) {
    pdVar1 = (double *)local_a0[0x12];
    puVar2 = (undefined8 *)local_a0[0x13];
    if ((*(int *)(local_a0 + 0x10) == 0) ||
       (local_4 = lsrkStep_ComputeNewDomEig
                            (in_stack_ffffffffffffff48,
                             (ARKodeLSRKStepMem)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),
       local_4 == 0)) {
      if (0.0 < ABS(in_RDI->h) * 8.0 * (double)local_a0[0xb] + 9.0) {
        local_d0 = sqrt(ABS(in_RDI->h) * 8.0 * (double)local_a0[0xb] + 9.0);
      }
      else {
        local_d0 = 0.0;
      }
      dVar6 = ceil((local_d0 - 1.0) / 2.0);
      if (dVar6 <= 2.0) {
        dVar6 = 2.0;
      }
      if (dVar6 < (double)*(int *)((long)local_a0 + 0x34)) {
        *(int *)(local_a0 + 3) = (int)dVar6;
        if (*(int *)(local_a0 + 6) < *(int *)(local_a0 + 3)) {
          uVar12 = *(undefined4 *)(local_a0 + 3);
        }
        else {
          uVar12 = *(undefined4 *)(local_a0 + 6);
        }
        *(undefined4 *)(local_a0 + 6) = uVar12;
        if (((in_RDI->fn_is_current == 0) && (in_RDI->initsetup != 0)) ||
           (local_a0[8] != in_RDI->nst)) {
          iVar4 = (*(code *)*local_a0)(in_RDI->tn,in_RDI->yn,in_RDI->fn,in_RDI->user_data);
          local_a0[4] = local_a0[4] + 1;
          if (iVar4 != 0) {
            return -8;
          }
          in_RDI->fn_is_current = 1;
        }
        local_a0[8] = in_RDI->nst + 1;
        dVar6 = 4.0 / (((double)*(int *)(local_a0 + 3) + 2.0) *
                      ((double)*(int *)(local_a0 + 3) - 1.0));
        local_48 = 0.3333333333333333;
        local_40 = 0.3333333333333333;
        N_VScale(0x3ff0000000000000,in_RDI->yn,in_RDI->tempv1);
        local_68 = dVar6 * 0.3333333333333333;
        N_VLinearSum(0x3ff0000000000000,in_RDI->h * local_68,in_RDI->yn,in_RDI->fn,in_RDI->tempv2);
        if ((in_RDI->ProcessStage == (ARKPostProcessFn)0x0) ||
           (iVar4 = (*in_RDI->ProcessStage)
                              (in_RDI->h * local_68 + in_RDI->tn,in_RDI->tempv2,in_RDI->user_data),
           iVar4 == 0)) {
          for (iVar4 = 2; iVar4 <= *(int *)(local_a0 + 3); iVar4 = iVar4 + 1) {
            dVar7 = ((double)iVar4 + 2.0) * ((double)iVar4 - 1.0);
            dVar8 = dVar7 / ((double)iVar4 * 2.0 * ((double)iVar4 + 1.0));
            dVar9 = (((double)iVar4 + (double)iVar4 + -1.0) / (double)iVar4) * (dVar8 / local_40);
            dVar10 = (-((double)iVar4 - 1.0) / (double)iVar4) * (dVar8 / local_48);
            dVar7 = (dVar7 * dVar6) / 4.0;
            iVar5 = (*(code *)*local_a0)
                              (in_RDI->h * local_68 + in_RDI->tcur,in_RDI->tempv2,in_RDI->ycur,
                               in_RDI->user_data);
            local_a0[4] = local_a0[4] + 1;
            if (iVar5 < 0) {
              return -8;
            }
            if (0 < iVar5) {
              return 9;
            }
            *pdVar1 = dVar6 * dVar9 * in_RDI->h;
            *puVar2 = in_RDI->ycur;
            pdVar1[1] = dVar10;
            puVar2[1] = in_RDI->tempv1;
            pdVar1[2] = (1.0 - dVar9) - dVar10;
            puVar2[2] = in_RDI->yn;
            pdVar1[3] = dVar9;
            puVar2[3] = in_RDI->tempv2;
            pdVar1[4] = -(dVar6 * dVar9) * (1.0 - local_40) * in_RDI->h;
            puVar2[4] = in_RDI->fn;
            iVar5 = N_VLinearCombination(5,pdVar1,puVar2,in_RDI->ycur);
            if (iVar5 != 0) {
              return -0x1c;
            }
            if (((in_RDI->ProcessStage != (ARKPostProcessFn)0x0) && (iVar4 < *(int *)(local_a0 + 3))
                ) && (iVar5 = (*in_RDI->ProcessStage)
                                        (in_RDI->h * dVar7 + in_RDI->tcur,in_RDI->ycur,
                                         in_RDI->user_data), iVar5 != 0)) {
              return -0x26;
            }
            if (iVar4 < *(int *)(local_a0 + 3)) {
              p_Var3 = in_RDI->tempv1;
              in_RDI->tempv1 = in_RDI->tempv2;
              in_RDI->tempv2 = p_Var3;
              N_VScale(0x3ff0000000000000,in_RDI->ycur,in_RDI->tempv2);
              local_48 = local_40;
              local_68 = dVar7;
              local_40 = dVar8;
            }
          }
          if (in_RDI->fixedstep == 0) {
            iVar4 = (*(code *)*local_a0)
                              (in_RDI->tcur + in_RDI->h,in_RDI->ycur,in_RDI->tempv2,
                               in_RDI->user_data);
            local_a0[4] = local_a0[4] + 1;
            if (iVar4 < 0) {
              return -8;
            }
            if (0 < iVar4) {
              return 9;
            }
            *pdVar1 = 0.8;
            *puVar2 = in_RDI->yn;
            pdVar1[1] = -0.8;
            puVar2[1] = in_RDI->ycur;
            pdVar1[2] = in_RDI->h * 0.4;
            puVar2[2] = in_RDI->fn;
            pdVar1[3] = in_RDI->h * 0.4;
            puVar2[3] = in_RDI->tempv2;
            iVar4 = N_VLinearCombination(4,pdVar1,puVar2,in_RDI->tempv1);
            if (iVar4 != 0) {
              return -0x1c;
            }
            uVar11 = N_VWrmsNorm(in_RDI->tempv1,in_RDI->ewt);
            *in_RSI = uVar11;
            lsrkStep_DomEigUpdateLogic
                      ((ARKodeMem)CONCAT44(uVar12,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff18,7.38712131692457e-318);
          }
          else {
            iVar4 = (*(code *)*local_a0)
                              (in_RDI->tcur + in_RDI->h,in_RDI->ycur,in_RDI->tempv2,
                               in_RDI->user_data);
            local_a0[4] = local_a0[4] + 1;
            if (iVar4 < 0) {
              return -8;
            }
            if (0 < iVar4) {
              return 9;
            }
            lsrkStep_DomEigUpdateLogic
                      ((ARKodeMem)CONCAT44(uVar12,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff18,7.38805510099521e-318);
          }
          local_4 = 0;
        }
        else {
          local_4 = -0x26;
        }
      }
      else if (in_RDI->fixedstep == 0) {
        in_RDI->eta = ((in_RDI->hadapt_mem->safety *
                       ((double)(*(int *)((long)local_a0 + 0x34) * *(int *)((long)local_a0 + 0x34) +
                                *(int *)((long)local_a0 + 0x34)) - 2.0)) /
                      ((double)local_a0[0xb] * 2.0)) / in_RDI->h;
        *in_RDX = 0xb;
        in_RDI->hadapt_mem->nst_exp = in_RDI->hadapt_mem->nst_exp + 1;
        local_4 = 0xb;
      }
      else {
        arkProcessError(in_RDI,-0x32,0x355,"lsrkStep_TakeStepRKL",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                        ,
                        "Unable to achieve stable results: Either reduce the step size or increase the stage_max_limit"
                       );
        local_4 = -0x32;
      }
    }
  }
  return local_4;
}

Assistant:

int lsrkStep_TakeStepRKL(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  int retval;
  sunrealtype hmax, w1, bjm1, bjm2, mus, bj, ajm1, cjm1, temj, cj, mu, nu;
  const sunrealtype p8 = SUN_RCONST(0.8), p4 = SUN_RCONST(0.4);
  ARKodeLSRKStepMem step_mem;

  /* initialize algebraic solver convergence flag to success,
     temporal error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr   = ZERO;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  sunrealtype* cvals = step_mem->cvals;
  N_Vector* Xvecs    = step_mem->Xvecs;

  /* Compute dominant eigenvalue and update stats */
  if (step_mem->dom_eig_update)
  {
    retval = lsrkStep_ComputeNewDomEig(ark_mem, step_mem);
    if (retval != ARK_SUCCESS) { return retval; }
  }

  sunrealtype ss =
    SUNRceil((SUNRsqrt(SUN_RCONST(9.0) + SUN_RCONST(8.0) * SUNRabs(ark_mem->h) *
                                           step_mem->spectral_radius) -
              ONE) /
             TWO);

  ss = SUNMAX(ss, SUN_RCONST(2.0));

  if (ss >= step_mem->stage_max_limit)
  {
    SUNLogInfo(ARK_LOGGER, "compute-num-stages",
               "spectral radius = " SUN_FORMAT_G ", num stages = " SUN_FORMAT_G
               ", max stages = %i, max stage limit = %i",
               step_mem->spectral_radius, ss, step_mem->stage_max,
               step_mem->stage_max_limit);

    if (!ark_mem->fixedstep)
    {
      hmax =
        ark_mem->hadapt_mem->safety *
        (SUNSQR(step_mem->stage_max_limit) + step_mem->stage_max_limit - TWO) /
        (TWO * step_mem->spectral_radius);
      ark_mem->eta = hmax / ark_mem->h;
      *nflagPtr    = ARK_RETRY_STEP;
      ark_mem->hadapt_mem->nst_exp++;
      return ARK_RETRY_STEP;
    }
    else
    {
      arkProcessError(ark_mem, ARK_MAX_STAGE_LIMIT_FAIL, __LINE__, __func__,
                      __FILE__,
                      "Unable to achieve stable results: Either reduce the "
                      "step size or increase the stage_max_limit");
      return ARK_MAX_STAGE_LIMIT_FAIL;
    }
  }

  step_mem->req_stages = (int)ss;
  step_mem->stage_max  = SUNMAX(step_mem->req_stages, step_mem->stage_max);

  SUNLogInfo(ARK_LOGGER, "compute-num-stages",
             "spectral radius = " SUN_FORMAT_G
             ", num stages = %i, max stages = %i, max stage limit = %i",
             step_mem->spectral_radius, step_mem->req_stages,
             step_mem->stage_max, step_mem->stage_max_limit);
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 0,
             ark_mem->tcur);
  SUNLogExtraDebugVec(ARK_LOGGER, "stage", ark_mem->yn, "z_0(:) =");

  /* Compute RHS function, if necessary. */
  if ((!ark_mem->fn_is_current && ark_mem->initsetup) ||
      (step_mem->step_nst != ark_mem->nst))
  {
    retval = step_mem->fe(ark_mem->tn, ark_mem->yn, ark_mem->fn,
                          ark_mem->user_data);
    step_mem->nfe++;
    if (retval != ARK_SUCCESS)
    {
      SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return (ARK_RHSFUNC_FAIL);
    }
    ark_mem->fn_is_current = SUNTRUE;
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  /* Track the number of successful steps to determine if the previous step failed. */
  step_mem->step_nst = ark_mem->nst + 1;

  w1 = FOUR / ((step_mem->req_stages + TWO) * (step_mem->req_stages - ONE));

  bjm2 = ONE / THREE;
  bjm1 = bjm2;

  /* Evaluate the first stage */
  N_VScale(ONE, ark_mem->yn, ark_mem->tempv1);

  mus  = w1 * bjm1;
  cjm1 = mus;

  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 1,
             ark_mem->tn + ark_mem->h * mus);

  N_VLinearSum(ONE, ark_mem->yn, ark_mem->h * mus, ark_mem->fn, ark_mem->tempv2);

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tn + ark_mem->h * mus,
                                   ark_mem->tempv2, ark_mem->user_data);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      return ARK_POSTPROCESS_STAGE_FAIL;
    }
  }

  /* Evaluate stages j = 2,...,step_mem->req_stages */
  for (int j = 2; j <= step_mem->req_stages; j++)
  {
    temj = (j + TWO) * (j - ONE);
    bj   = temj / (TWO * j * (j + ONE));
    ajm1 = ONE - bjm1;
    mu   = (TWO * j - ONE) / j * (bj / bjm1);
    nu   = -(j - ONE) / j * (bj / bjm2);
    mus  = w1 * mu;
    cj   = temj * w1 / FOUR;

    /* Use the ycur array for temporary storage here */
    retval = step_mem->fe(ark_mem->tcur + ark_mem->h * cjm1, ark_mem->tempv2,
                          ark_mem->ycur, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->ycur,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + ark_mem->h * cj);

    cvals[0] = mus * ark_mem->h;
    Xvecs[0] = ark_mem->ycur;
    cvals[1] = nu;
    Xvecs[1] = ark_mem->tempv1;
    cvals[2] = ONE - mu - nu;
    Xvecs[2] = ark_mem->yn;
    cvals[3] = mu;
    Xvecs[3] = ark_mem->tempv2;
    cvals[4] = -mus * ajm1 * ark_mem->h;
    Xvecs[4] = ark_mem->fn;

    retval = N_VLinearCombination(5, cvals, Xvecs, ark_mem->ycur);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed vector op, retval = %i", retval);
      return ARK_VECTOROP_ERR;
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL && j < step_mem->req_stages)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur + ark_mem->h * cj,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }

    /* Shift the data for the next stage */
    if (j < step_mem->req_stages)
    {
      /* To avoid two data copies we swap ARKODE's tempv1 and tempv2 pointers*/
      N_Vector temp   = ark_mem->tempv1;
      ark_mem->tempv1 = ark_mem->tempv2;
      ark_mem->tempv2 = temp;

      N_VScale(ONE, ark_mem->ycur, ark_mem->tempv2);

      cjm1 = cj;
      bjm2 = bjm1;
      bjm1 = bj;
    }
  }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");
  SUNLogInfo(ARK_LOGGER, "begin-compute-embedding", "");

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    retval = step_mem->fe(ark_mem->tcur + ark_mem->h, ark_mem->ycur,
                          ark_mem->tempv2, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "solution RHS", ark_mem->tempv2, "F_n(:) =");
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-compute-embedding",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    /* Estimate the local error and compute its weighted RMS norm */
    cvals[0] = p8;
    Xvecs[0] = ark_mem->yn;
    cvals[1] = -p8;
    Xvecs[1] = ark_mem->ycur;
    cvals[2] = p4 * ark_mem->h;
    Xvecs[2] = ark_mem->fn;
    cvals[3] = p4 * ark_mem->h;
    Xvecs[3] = ark_mem->tempv2;

    retval = N_VLinearCombination(4, cvals, Xvecs, ark_mem->tempv1);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-compute-embedding",
                 "status = failed vector op, retval = %i", retval);
      return ARK_VECTOROP_ERR;
    }
    *dsmPtr = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);
    lsrkStep_DomEigUpdateLogic(ark_mem, step_mem, *dsmPtr);
  }
  else
  {
    retval = step_mem->fe(ark_mem->tcur + ark_mem->h, ark_mem->ycur,
                          ark_mem->tempv2, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "solution RHS", ark_mem->tempv2, "F_n(:) =");
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-compute-embedding",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    lsrkStep_DomEigUpdateLogic(ark_mem, step_mem, *dsmPtr);
  }

  SUNLogInfo(ARK_LOGGER, "end-compute-embedding", "status = success");

  return ARK_SUCCESS;
}